

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fFunctionalTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::ShaderLibraryGroup::init(ShaderLibraryGroup *this,EVP_PKEY_CTX *ctx)

{
  File *pFVar1;
  ShaderLibraryTest *this_00;
  long lVar2;
  int local_14;
  int ndx;
  ShaderLibraryGroup *this_local;
  
  for (local_14 = 0; local_14 < this->m_numFiles; local_14 = local_14 + 1) {
    this_00 = (ShaderLibraryTest *)operator_new(0x98);
    pFVar1 = this->m_files;
    lVar2 = (long)local_14;
    ShaderLibraryTest::ShaderLibraryTest
              (this_00,(this->super_TestCaseGroup).m_context,pFVar1[lVar2].fileName,
               pFVar1[lVar2].testName,pFVar1[lVar2].description);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
  }
  return local_14;
}

Assistant:

void init (void)
	{
		for (int ndx = 0; ndx < m_numFiles; ++ndx)
			addChild(new ShaderLibraryTest(m_context, m_files[ndx].fileName, m_files[ndx].testName, m_files[ndx].description));
	}